

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O0

void __thiscall
PlantUmlGenerator::generate(PlantUmlGenerator *this,ostream *output,ScName *name,int indentLevel)

{
  ScHistoryMode historyMode_00;
  bool bVar1;
  ScStateMap *this_00;
  mapped_type *pmVar2;
  ScName *pSVar3;
  value_type *pvVar4;
  ostream *poVar5;
  const_reference name_00;
  reference pbVar6;
  reference __in;
  type *name_01;
  type *this_01;
  ulong uVar7;
  undefined1 local_140 [8];
  ScName targetAlias;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *eventName_1;
  iterator __end2_2;
  iterator __begin2_2;
  type *__range2_2;
  bool isTransitionHighlighted;
  type *eventNames;
  type *target;
  _Self local_e0;
  const_iterator __end1;
  const_iterator __begin1;
  ScTransitionMap *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *eventName;
  iterator __end2_1;
  iterator __begin2_1;
  ScNameSet *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *substateName;
  iterator __end2;
  iterator __begin2;
  ScNameSet *__range2;
  value_type *substates;
  ScRegionNum regionNum;
  size_type totalRegions;
  ScHistoryMode historyMode;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string indent;
  ScName *nameAlias;
  mapped_type *state;
  int indentLevel_local;
  ScName *name_local;
  ostream *output_local;
  PlantUmlGenerator *this_local;
  
  this_00 = ScModel::states_abi_cxx11_((this->super_AbstractGenerator).m_model);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::at(this_00,name);
  indent.field_2._8_8_ = alias(this,name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,(long)(indentLevel * 2),' ',&local_59);
  std::allocator<char>::~allocator(&local_59);
  if (0 < indentLevel) {
    beginState(this,output,(string *)local_58,name,(ScName *)indent.field_2._8_8_);
  }
  historyMode_00 = (pmVar2->historyState).mode;
  if (historyMode_00 != None) {
    pSVar3 = alias(this,&(pmVar2->historyState).initial);
    historyPseudoState(this,output,(string *)local_58,pSVar3,historyMode_00);
  }
  pvVar4 = (value_type *)std::vector<ScRegion,_std::allocator<ScRegion>_>::size(&pmVar2->regions);
  for (substates = (value_type *)0x0; substates < pvVar4;
      substates = (value_type *)&(substates->initial).field_0x1) {
    if (substates != (value_type *)0x0) {
      poVar5 = std::operator<<(output,(string *)local_58);
      std::operator<<(poVar5,"--\n");
    }
    name_00 = std::vector<ScRegion,_std::allocator<ScRegion>_>::operator[]
                        (&pmVar2->regions,(size_type)substates);
    poVar5 = std::operator<<(output,(string *)local_58);
    poVar5 = std::operator<<(poVar5,"[*] --> ");
    pSVar3 = alias(this,&name_00->initial);
    poVar5 = std::operator<<(poVar5,(string *)pSVar3);
    std::operator<<(poVar5,"\n");
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&name_00->states);
    substateName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&name_00->states);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&substateName), bVar1) {
      pbVar6 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      generate(this,output,pbVar6,indentLevel + 1);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  if (0 < indentLevel) {
    endState(this,output,(string *)local_58);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&pmVar2->deferrals);
  if (!bVar1) {
    poVar5 = std::operator<<(output,(string *)local_58);
    poVar5 = std::operator<<(poVar5,(string *)indent.field_2._8_8_);
    std::operator<<(poVar5," : Deferrals:\n");
    __end2_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pmVar2->deferrals);
    eventName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&pmVar2->deferrals);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&eventName), bVar1) {
      pbVar6 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2_1);
      deferralLink(this,output,(string *)local_58,(ScName *)indent.field_2._8_8_,pbVar6);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
  }
  __end1 = std::
           map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::begin(&pmVar2->transitions);
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ScTarget>,_std::allocator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end(&pmVar2->transitions);
  while (bVar1 = std::operator!=(&__end1,&local_e0), bVar1) {
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&__end1);
    name_01 = std::
              get<0ul,ScTarget_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        (__in);
    this_01 = std::
              get<1ul,ScTarget_const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        (__in);
    __range2_2._7_1_ = false;
    __end2_2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
    eventName_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this_01);
    while (bVar1 = std::operator!=(&__end2_2,(_Self *)&eventName_1), bVar1) {
      targetAlias.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2_2);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (bVar1 = ::AbstractGenerator::isHighlighted
                            (&this->super_AbstractGenerator,(ScName *)targetAlias.field_2._8_8_),
         bVar1)) {
        __range2_2._7_1_ = true;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_2);
    }
    pSVar3 = alias(this,&name_01->name);
    std::__cxx11::string::string((string *)local_140,(string *)pSVar3);
    if (name_01->historyMode != None) {
      puHistoryState(name_01->historyMode);
      std::__cxx11::string::append(local_140);
    }
    transitionLink(this,output,(string *)local_58,__range2_2._7_1_,(ScName *)indent.field_2._8_8_,
                   (ScName *)local_140,this_01);
    std::__cxx11::string::~string((string *)local_140);
    std::
    _Rb_tree_const_iterator<std::pair<const_ScTarget,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void PlantUmlGenerator::generate(std::ostream &output, const ScName &name, int indentLevel)
{
    const auto &state = m_model.states().at(name);
    const auto &nameAlias = alias(name);

    std::string indent(indentLevel * 2, ' ');

    // Exclude the outerbox with a state machine name:
    if (indentLevel > 0) {
        beginState(output, indent, name, nameAlias);
    }

    // History pseudo-state:
    if (auto historyMode = state.historyState.mode; historyMode != ScHistoryMode::None) {
        historyPseudoState(output, indent, alias(state.historyState.initial), historyMode);
    }

    // Substates:
    const auto totalRegions = state.regions.size();
    for (ScRegionNum regionNum = 0; regionNum < totalRegions; regionNum++) {
        if (regionNum > 0) {
            output << indent << "--\n";
        }

        const auto &substates = state.regions[regionNum];
        output << indent << "[*] --> " << alias(substates.initial) << "\n";
        for (const auto &substateName : substates.states) {
            generate(output, substateName, indentLevel + 1);
        }
    }

    if (indentLevel > 0) {
        endState(output, indent);
    }

    // Deferrals:
    if (!state.deferrals.empty()) {
        output << indent << nameAlias << " : Deferrals:\n";
        for (const auto &eventName : state.deferrals) {
            deferralLink(output, indent, nameAlias, eventName);
        }
    }

    // Transitions:
    for (const auto &[target, eventNames] : state.transitions) {
        bool isTransitionHighlighted = false;
        for (const auto &eventName : eventNames) {
            if (!eventName.empty() && isHighlighted(eventName)) {
                isTransitionHighlighted = true;
            }
        }

        auto targetAlias = alias(target.name);

        // History states in PlantUML can be references as StateName[H] or StateName[H*]:
        if (target.historyMode != ScHistoryMode::None) {
            targetAlias.append(puHistoryState(target.historyMode));
        }

        transitionLink(output, indent, isTransitionHighlighted, nameAlias, targetAlias, eventNames);
    }
}